

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldActivator.cpp
# Opt level: O2

XPathMatcher * __thiscall
xercesc_4_0::FieldActivator::activateField(FieldActivator *this,IC_Field *field,int initialDepth)

{
  ValueStore *valueStore;
  XPathMatcher *matcher;
  
  valueStore = ValueStoreCache::getValueStoreFor(this->fValueStoreCache,field,initialDepth);
  matcher = IC_Field::createMatcher(field,this,valueStore,this->fMemoryManager);
  setMayMatch(this,field,true);
  XPathMatcherStack::addMatcher(this->fMatcherStack,matcher);
  (*matcher->_vptr_XPathMatcher[3])(matcher);
  return matcher;
}

Assistant:

XPathMatcher* FieldActivator::activateField(IC_Field* const field, const int initialDepth) {

    ValueStore* valueStore = fValueStoreCache->getValueStoreFor(field, initialDepth);
    XPathMatcher* matcher = field->createMatcher(this, valueStore, fMemoryManager);

    setMayMatch(field, true);
    fMatcherStack->addMatcher(matcher);
    matcher->startDocumentFragment();

    return matcher;
}